

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::build_composite_combiner_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t return_type,uint32_t *elems,
          uint32_t length)

{
  uint32_t uVar1;
  bool bVar2;
  bool block_like_type;
  SPIRType *pSVar3;
  SPIRExpression *pSVar4;
  ulong uVar5;
  uint32_t base;
  CompilerGLSL *pCVar6;
  bool bVar7;
  string subop;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  subop._M_dataplus._M_p = (pointer)&subop.field_2;
  subop._M_string_length = 0;
  subop.field_2._M_local_buf[0] = '\0';
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,return_type);
  base = 0;
  if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
    bVar7 = false;
  }
  else {
    bVar7 = false;
    if ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      bVar7 = pSVar3->columns == 1;
    }
  }
  uVar5 = 0;
  bVar2 = false;
  do {
    if (length == uVar5) {
      if (bVar2) {
        if ((this->backend).swizzle_is_function == true) {
          ::std::__cxx11::string::append((char *)&subop);
        }
        pCVar6 = this;
        bVar7 = remove_duplicate_swizzle(this,&subop);
        if (!bVar7) {
          remove_unity_swizzle(this,base,&subop);
          pCVar6 = this;
        }
        strip_enclosed_expression(pCVar6,&subop);
      }
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&subop);
      return __return_storage_ptr__;
    }
    pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,elems[uVar5]);
    if ((pSVar4 == (SPIRExpression *)0x0 || !bVar7) ||
       (uVar1 = *(uint32_t *)&(pSVar4->super_IVariant).field_0xc, uVar1 != base || uVar1 == 0)) {
      if (bVar2) {
        if ((this->backend).swizzle_is_function == true) {
          ::std::__cxx11::string::append((char *)&subop);
        }
        pCVar6 = this;
        bVar2 = remove_duplicate_swizzle(this,&subop);
        if (!bVar2) {
          pCVar6 = this;
          remove_unity_swizzle(this,base,&subop);
        }
        strip_enclosed_expression(pCVar6,&subop);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        bVar2 = false;
      }
      else {
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      if (uVar5 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
        block_like_type =
             Compiler::has_member_decoration
                       (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,
                        (uint32_t)uVar5,DecorationOffset);
      }
      else {
        block_like_type = false;
      }
      to_composite_constructor_expression_abi_cxx11_(&local_50,this,elems[uVar5],block_like_type);
      ::std::__cxx11::string::operator=((string *)&subop,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (pSVar4 != (SPIRExpression *)0x0) goto LAB_00262e16;
      base = 0;
    }
    else {
      if (((pSVar4->expression)._M_string_length == 0) ||
         (*(pSVar4->expression)._M_dataplus._M_p != '.')) {
        __assert_fail("!e->expression.empty() && e->expression.front() == \'.\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x27fa,
                      "string spirv_cross::CompilerGLSL::build_composite_combiner(uint32_t, const uint32_t *, uint32_t)"
                     );
      }
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)&pSVar4->expression);
      ::std::__cxx11::string::append((string *)&subop);
      ::std::__cxx11::string::~string((string *)&local_50);
      bVar2 = true;
LAB_00262e16:
      base = *(uint32_t *)&(pSVar4->super_IVariant).field_0xc;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::build_composite_combiner(uint32_t return_type, const uint32_t *elems, uint32_t length)
{
	ID base = 0;
	string op;
	string subop;

	// Can only merge swizzles for vectors.
	auto &type = get<SPIRType>(return_type);
	bool can_apply_swizzle_opt = type.basetype != SPIRType::Struct && type.array.empty() && type.columns == 1;
	bool swizzle_optimization = false;

	for (uint32_t i = 0; i < length; i++)
	{
		auto *e = maybe_get<SPIRExpression>(elems[i]);

		// If we're merging another scalar which belongs to the same base
		// object, just merge the swizzles to avoid triggering more than 1 expression read as much as possible!
		if (can_apply_swizzle_opt && e && e->base_expression && e->base_expression == base)
		{
			// Only supposed to be used for vector swizzle -> scalar.
			assert(!e->expression.empty() && e->expression.front() == '.');
			subop += e->expression.substr(1, string::npos);
			swizzle_optimization = true;
		}
		else
		{
			// We'll likely end up with duplicated swizzles, e.g.
			// foobar.xyz.xyz from patterns like
			// OpVectorShuffle
			// OpCompositeExtract x 3
			// OpCompositeConstruct 3x + other scalar.
			// Just modify op in-place.
			if (swizzle_optimization)
			{
				if (backend.swizzle_is_function)
					subop += "()";

				// Don't attempt to remove unity swizzling if we managed to remove duplicate swizzles.
				// The base "foo" might be vec4, while foo.xyz is vec3 (OpVectorShuffle) and looks like a vec3 due to the .xyz tacked on.
				// We only want to remove the swizzles if we're certain that the resulting base will be the same vecsize.
				// Essentially, we can only remove one set of swizzles, since that's what we have control over ...
				// Case 1:
				//  foo.yxz.xyz: Duplicate swizzle kicks in, giving foo.yxz, we are done.
				//               foo.yxz was the result of OpVectorShuffle and we don't know the type of foo.
				// Case 2:
				//  foo.xyz: Duplicate swizzle won't kick in.
				//           If foo is vec3, we can remove xyz, giving just foo.
				if (!remove_duplicate_swizzle(subop))
					remove_unity_swizzle(base, subop);

				// Strips away redundant parens if we created them during component extraction.
				strip_enclosed_expression(subop);
				swizzle_optimization = false;
				op += subop;
			}
			else
				op += subop;

			if (i)
				op += ", ";

			bool uses_buffer_offset =
			    type.basetype == SPIRType::Struct && has_member_decoration(type.self, i, DecorationOffset);
			subop = to_composite_constructor_expression(elems[i], uses_buffer_offset);
		}

		base = e ? e->base_expression : ID(0);
	}

	if (swizzle_optimization)
	{
		if (backend.swizzle_is_function)
			subop += "()";

		if (!remove_duplicate_swizzle(subop))
			remove_unity_swizzle(base, subop);
		// Strips away redundant parens if we created them during component extraction.
		strip_enclosed_expression(subop);
	}

	op += subop;
	return op;
}